

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_extract.cpp
# Opt level: O3

ScalarFunction * duckdb::GetKeyExtractFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling null_handling;
  bind_lambda_function_t in_stack_ffffffffffffff18;
  scalar_function_t local_e0;
  LogicalType local_c0;
  vector<duckdb::LogicalType,_true> local_a8;
  string local_90;
  LogicalType local_70;
  LogicalType local_58 [2];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"struct_extract","");
  LogicalType::LogicalType(local_58,STRUCT);
  LogicalType::LogicalType(local_58 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a8,__l,
             (allocator_type *)&stack0xffffffffffffff1f);
  LogicalType::LogicalType(&local_c0,ANY);
  local_e0.super__Function_base._M_functor._8_8_ = 0;
  local_e0.super__Function_base._M_functor._M_unused._M_object = StructExtractFunction;
  local_e0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  null_handling = 0xd2;
  LogicalType::LogicalType(&local_70,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_90,&local_a8,&local_c0,&local_e0,StructExtractBind,
             (bind_scalar_function_extended_t)0x0,PropagateStructExtractStats,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_70),CONSISTENT,null_handling,
             in_stack_ffffffffffffff18);
  LogicalType::~LogicalType(&local_70);
  if (local_e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e0.super__Function_base._M_manager)
              ((_Any_data *)&local_e0,(_Any_data *)&local_e0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

ScalarFunction GetKeyExtractFunction() {
	return ScalarFunction("struct_extract", {LogicalTypeId::STRUCT, LogicalType::VARCHAR}, LogicalType::ANY,
	                      StructExtractFunction, StructExtractBind, nullptr, PropagateStructExtractStats);
}